

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_link.c
# Opt level: O3

int metacall_link_initialize(void)

{
  int iVar1;
  char *pcVar2;
  detour d;
  size_t line;
  
  pcVar2 = metacall_detour();
  d = detour_create(pcVar2);
  iVar1 = threading_mutex_initialize(&link_mutex);
  if (iVar1 == 0) {
    if ((detour_link_handle == (detour_handle)0x0) &&
       (detour_link_handle = detour_install(d,dlsym,metacall_link_hook),
       detour_link_handle == (detour_handle)0x0)) {
      pcVar2 = "MetaCall invalid detour link installation";
      line = 0x93;
    }
    else {
      if (metacall_link_table != (set)0x0) {
        return 0;
      }
      metacall_link_table = set_create(hash_callback_str,comparable_callback_str);
      if (metacall_link_table != (set)0x0) {
        return 0;
      }
      pcVar2 = "MetaCall failed to create link table";
      line = 0xa1;
      metacall_link_table = (set)0x0;
    }
    log_write_impl_va("metacall",line,"metacall_link_initialize",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall_link.c"
                      ,LOG_LEVEL_ERROR,pcVar2);
    metacall_link_destroy();
  }
  else {
    log_write_impl_va("metacall",0x88,"metacall_link_initialize",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall_link.c"
                      ,LOG_LEVEL_ERROR,"MetaCall invalid link mutex initialization");
  }
  return 1;
}

Assistant:

int metacall_link_initialize(void)
{
	detour d = detour_create(metacall_detour());

	if (threading_mutex_initialize(&link_mutex) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "MetaCall invalid link mutex initialization");

		return 1;
	}

	if (detour_link_handle == NULL)
	{
		detour_link_handle = detour_install(d, (void (*)(void))metacall_link_func(), (void (*)(void))(&metacall_link_hook));

		if (detour_link_handle == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "MetaCall invalid detour link installation");

			metacall_link_destroy();

			return 1;
		}
	}

	if (metacall_link_table == NULL)
	{
		metacall_link_table = set_create(&hash_callback_str, &comparable_callback_str);

		if (metacall_link_table == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "MetaCall failed to create link table");

			metacall_link_destroy();

			return 1;
		}
	}

	return 0;
}